

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::project_classification
               (Mesh *mesh,Int ent_dim,Write<signed_char> *class_dim,Write<int> *class_id,
               bool relaxed)

{
  void **__return_storage_ptr__;
  LO n;
  undefined1 local_168 [8];
  type f;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Read<int> high_class_id;
  string local_c0 [32];
  undefined1 local_a0 [8];
  Read<signed_char> high_class_dim;
  LOs lh2h;
  undefined1 local_70 [8];
  LOs l2lh;
  Adj l2h;
  bool relaxed_local;
  Write<int> *class_id_local;
  Write<signed_char> *class_dim_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  __return_storage_ptr__ = &l2lh.write_.shared_alloc_.direct_ptr;
  l2h.codes.write_.shared_alloc_.direct_ptr._7_1_ = relaxed;
  Mesh::ask_up((Adj *)__return_storage_ptr__,mesh,ent_dim,ent_dim + 1);
  Read<int>::Read((Read<int> *)local_70,(Read<int> *)__return_storage_ptr__);
  Read<int>::Read((Read<int> *)&high_class_dim.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&l2h.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"class_dim",
             (allocator *)((long)&high_class_id.write_.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_a0,(Int)mesh,(string *)(ulong)(ent_dim + 1));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&high_class_id.write_.shared_alloc_.direct_ptr + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"class_id",(allocator *)((long)&f.ent_dim + 3));
  Mesh::get_array<int>((Mesh *)local_d8,(Int)mesh,(string *)(ulong)(ent_dim + 1));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.ent_dim + 3));
  Write<signed_char>::Write((Write<signed_char> *)local_168,class_dim);
  Write<int>::Write((Write<int> *)&f.class_dim.shared_alloc_.direct_ptr,class_id);
  Read<int>::Read((Read<int> *)&f.class_id.shared_alloc_.direct_ptr,(Read<int> *)local_70);
  Read<int>::Read((Read<int> *)&f.l2lh.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&high_class_dim.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.lh2h.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_a0);
  Read<int>::Read((Read<int> *)&f.high_class_dim.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_d8);
  f.high_class_id.write_.shared_alloc_.direct_ptr._0_1_ =
       l2h.codes.write_.shared_alloc_.direct_ptr._7_1_ & 1;
  f.high_class_id.write_.shared_alloc_.direct_ptr._4_4_ = ent_dim;
  n = Mesh::nents(mesh,ent_dim);
  parallel_for<Omega_h::project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::__0>
            (n,(type *)local_168,"project_classification");
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)local_168);
  Read<int>::~Read((Read<int> *)local_d8);
  Read<signed_char>::~Read((Read<signed_char> *)local_a0);
  Read<int>::~Read((Read<int> *)&high_class_dim.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_70);
  Adj::~Adj((Adj *)&l2lh.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void project_classification(Mesh* mesh, Int ent_dim, Write<I8> class_dim,
    Write<ClassId> class_id, bool relaxed) {
  auto l2h = mesh->ask_up(ent_dim, ent_dim + 1);
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto high_class_dim = mesh->get_array<I8>(ent_dim + 1, "class_dim");
  auto high_class_id = mesh->get_array<ClassId>(ent_dim + 1, "class_id");
  auto f = OMEGA_H_LAMBDA(LO l) {
    Int best_dim = class_dim[l];
    auto best_id = class_id[l];
    Int nadj = 0;
    for (auto lh = l2lh[l]; lh < l2lh[l + 1]; ++lh) {
      auto h = lh2h[lh];
      Int high_dim = high_class_dim[h];
      auto high_id = high_class_id[h];
      if (high_dim < best_dim) {
        best_dim = high_dim;
        best_id = high_id;
        nadj = 1;
      } else if (high_dim == best_dim) {
        if (high_id != best_id && (!relaxed || high_id != -1)) {
          if (best_id == -1) {
            best_id = high_id;
            ++nadj;
          } else {
            --best_dim;
            best_id = -1;
            nadj = 0;
          }
        } else {
          ++nadj;
        }
      }
    }
    if ((nadj != 2 && best_dim == ent_dim + 1) ||
        (nadj < 2 && best_dim > ent_dim + 1)) {
      best_dim = ent_dim;
      best_id = -1;
    }
    class_dim[l] = static_cast<I8>(best_dim);
    class_id[l] = best_id;
  };
  parallel_for(mesh->nents(ent_dim), f, "project_classification");
}